

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O2

void __thiscall glslang::HlslTokenStream::advanceToken(HlslTokenStream *this)

{
  pointer pHVar1;
  int *piVar2;
  HlslToken *pHVar3;
  int iVar4;
  pointer ppTVar5;
  pointer piVar6;
  TVector<glslang::HlslToken> *pTVar7;
  pointer pHVar8;
  TString *pTVar9;
  undefined8 uVar10;
  TSourceLoc *pTVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  HlslToken local_38;
  
  iVar4 = this->tokenBufferPos;
  this->tokenBuffer[iVar4].field_2 = (this->token).field_2;
  pTVar9 = (this->token).loc.name;
  iVar13 = (this->token).loc.string;
  iVar14 = (this->token).loc.line;
  uVar12 = *(undefined4 *)&(this->token).loc.field_0x14;
  uVar10 = *(undefined8 *)&(this->token).tokenClass;
  pTVar11 = &this->tokenBuffer[iVar4].loc;
  pTVar11->column = (this->token).loc.column;
  *(undefined4 *)&pTVar11->field_0x14 = uVar12;
  pTVar11[1].name = uVar10;
  pHVar3 = this->tokenBuffer + iVar4;
  (pHVar3->loc).name = pTVar9;
  (pHVar3->loc).string = iVar13;
  (pHVar3->loc).line = iVar14;
  this->tokenBufferPos = (this->tokenBufferPos + 1) % 2;
  if (this->preTokenStackSize < 1) {
    ppTVar5 = (this->tokenStreamStack).
              super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
              .
              super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar5 ==
        (this->tokenStreamStack).
        super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        .
        super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      HlslScanContext::tokenize(this->scanner,&this->token);
      return;
    }
    piVar6 = (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
             super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar15 = (long)piVar6[-1] + 1;
    piVar6[-1] = (int)lVar15;
    pTVar7 = ppTVar5[-1];
    pHVar8 = (pTVar7->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
             ).super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(pTVar7->
                     super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>)
                     .
                     super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8) / 0x28) <=
        (int)lVar15) {
      (this->token).tokenClass = EHTokNone;
      return;
    }
    (this->token).field_2 = pHVar8[lVar15].field_2;
    pHVar1 = pHVar8 + lVar15;
    local_38.loc.name._0_4_ = *(undefined4 *)&(pHVar1->loc).name;
    local_38.loc.name._4_4_ = *(undefined4 *)((long)&(pHVar1->loc).name + 4);
    local_38.loc.string = (pHVar1->loc).string;
    local_38.loc.line = (pHVar1->loc).line;
    piVar2 = &pHVar8[lVar15].loc.column;
    local_38.loc.column = *piVar2;
    local_38.loc._20_4_ = piVar2[1];
    local_38.tokenClass = piVar2[2];
    local_38._28_4_ = piVar2[3];
  }
  else {
    popPreToken(&local_38,this);
    (this->token).field_2 = local_38.field_2;
  }
  (this->token).loc.column = local_38.loc.column;
  *(undefined4 *)&(this->token).loc.field_0x14 = local_38.loc._20_4_;
  (this->token).tokenClass = local_38.tokenClass;
  *(undefined4 *)&(this->token).field_0x1c = local_38._28_4_;
  *(undefined4 *)&(this->token).loc.name = local_38.loc.name._0_4_;
  *(undefined4 *)((long)&(this->token).loc.name + 4) = local_38.loc.name._4_4_;
  (this->token).loc.string = local_38.loc.string;
  (this->token).loc.line = local_38.loc.line;
  return;
}

Assistant:

void HlslTokenStream::advanceToken()
{
    pushTokenBuffer(token);
    if (preTokenStackSize > 0)
        token = popPreToken();
    else {
        if (tokenStreamStack.size() == 0)
            scanner.tokenize(token);
        else {
            ++tokenPosition.back();
            if (tokenPosition.back() >= (int)tokenStreamStack.back()->size())
                token.tokenClass = EHTokNone;
            else
                token = (*tokenStreamStack.back())[tokenPosition.back()];
        }
    }
}